

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

int __thiscall Connection::connect(Connection *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  runtime_error *this_00;
  int *piVar1;
  undefined4 in_register_00000034;
  allocator local_59;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  undefined4 local_18;
  int numsec;
  int ret;
  Connection *this_local;
  
  local_18 = 1;
  _numsec = this;
  if (0 < this->kMaxTimeout) {
    ::connect(this->forwarding_socket_,(sockaddr *)this->serveraddr_,0x10);
    this->connected = true;
    return (int)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,__fd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"connect: ",&local_59);
  piVar1 = __errno_location();
  strerror(*piVar1);
  std::operator+(local_38,(char *)local_58);
  std::runtime_error::runtime_error(this_00,(string *)local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Connection::connect() {
    int ret;
    for (int numsec = 1; numsec <= kMaxTimeout; numsec *= 2) {
        ret = ::connect(forwarding_socket_, reinterpret_cast<sockaddr *> (serveraddr_), sizeof(*serveraddr_));
        connected = true;
        return;
    }
    throw std::runtime_error(std::string("connect: ") + strerror(errno));
}